

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O0

void arg_print_syntaxv(FILE *fp,void **argtable,char *suffix)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  char *datatype;
  char *longopts;
  char *shortopts;
  char syntax [200];
  int tabindex;
  int i;
  arg_hdr **table;
  char *suffix_local;
  void **argtable_local;
  FILE *fp_local;
  
  syntax[0xc0] = '\0';
  syntax[0xc1] = '\0';
  syntax[0xc2] = '\0';
  syntax[0xc3] = '\0';
  while( true ) {
    bVar4 = false;
    if (argtable[(int)syntax._192_4_] != (void *)0x0) {
      bVar4 = (*argtable[(int)syntax._192_4_] & 1) == 0;
    }
    if (!bVar4) break;
    memset(&shortopts,0,200);
    arg_cat_optionv((char *)&shortopts,200,*(char **)((long)argtable[(int)syntax._192_4_] + 8),
                    *(char **)((long)argtable[(int)syntax._192_4_] + 0x10),
                    *(char **)((long)argtable[(int)syntax._192_4_] + 0x18),
                    (int)*argtable[(int)syntax._192_4_] & 4,"|");
    syntax[0xc4] = '\0';
    syntax[0xc5] = '\0';
    syntax[0xc6] = '\0';
    syntax[199] = '\0';
    for (; (int)syntax._196_4_ < *(int *)((long)argtable[(int)syntax._192_4_] + 0x28);
        syntax._196_4_ = syntax._196_4_ + 1) {
      fprintf((FILE *)fp," %s",&shortopts);
    }
    iVar1 = *(int *)((long)argtable[(int)syntax._192_4_] + 0x28);
    iVar2 = *(int *)((long)argtable[(int)syntax._192_4_] + 0x2c);
    iVar3 = iVar2 - iVar1;
    if (iVar2 != iVar1) {
      if (iVar3 == 1) {
        fprintf((FILE *)fp," [%s]",&shortopts);
      }
      else if (iVar3 == 2) {
        fprintf((FILE *)fp," [%s] [%s]",&shortopts,&shortopts);
      }
      else {
        fprintf((FILE *)fp," [%s]...",&shortopts);
      }
    }
    syntax._192_4_ = syntax._192_4_ + 1;
  }
  if (suffix != (char *)0x0) {
    fprintf((FILE *)fp,"%s",suffix);
  }
  return;
}

Assistant:

void arg_print_syntaxv(FILE * fp, void * *argtable, const char * suffix) {
	struct arg_hdr * *table = (struct arg_hdr * *)argtable;
	int i, tabindex;

	/* print remaining options in abbreviated style */
	for (tabindex = 0;
			table[tabindex] && !(table[tabindex]->flag & ARG_TERMINATOR);
			tabindex++) {
		char syntax[200] = "";
		const char * shortopts, *longopts, *datatype;

		shortopts = table[tabindex]->shortopts;
		longopts  = table[tabindex]->longopts;
		datatype  = table[tabindex]->datatype;
		arg_cat_optionv(syntax,
						sizeof(syntax),
						shortopts,
						longopts,
						datatype,
						table[tabindex]->flag & ARG_HASOPTVALUE,
						"|");

		/* print mandatory options */
		for (i = 0; i < table[tabindex]->mincount; i++) {
			fprintf(fp, " %s", syntax);
		}

		/* print optional args enclosed in "[..]" */
		switch ( table[tabindex]->maxcount - table[tabindex]->mincount ) {
			case 0:
				break;

			case 1:
				fprintf(fp, " [%s]", syntax);
				break;

			case 2:
				fprintf(fp, " [%s] [%s]", syntax, syntax);
				break;

			default:
				fprintf(fp, " [%s]...", syntax);
				break;
		}
	}

	if (suffix) {
		fprintf(fp, "%s", suffix);
	}
}